

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Thing_Activate(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                     int arg4)

{
  AActor *pAVar1;
  AActor *temp;
  undefined1 local_48 [4];
  int count;
  FActorIterator iterator;
  AActor *actor;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      ln_local._4_4_ = 0;
    }
    else {
      DoActivateThing(it,it);
      ln_local._4_4_ = 1;
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)local_48,arg0);
    temp._4_4_ = 0;
    iterator._8_8_ = FActorIterator::Next((FActorIterator *)local_48);
    while (iterator._8_8_ != 0) {
      pAVar1 = FActorIterator::Next((FActorIterator *)local_48);
      DoActivateThing((AActor *)iterator._8_8_,it);
      temp._4_4_ = temp._4_4_ + 1;
      iterator._8_8_ = pAVar1;
    }
    ln_local._4_4_ = (uint)(temp._4_4_ != 0);
  }
  return ln_local._4_4_;
}

Assistant:

FUNC(LS_Thing_Activate)
// Thing_Activate (tid)
{
	if (arg0 != 0)
	{
		AActor *actor;
		FActorIterator iterator (arg0);
		int count = 0;

		actor = iterator.Next ();
		while (actor)
		{
			// Actor might remove itself as part of activation, so get next
			// one before activating it.
			AActor *temp = iterator.Next ();
			DoActivateThing(actor, it);
			actor = temp;
			count++;
		}

		return count != 0;
	}
	else if (it != NULL)
	{
		DoActivateThing(it, it);
		return true;
	}
	return false;
}